

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QWidget * __thiscall QAbstractItemView::indexWidget(QAbstractItemView *this,QModelIndex *index)

{
  bool bVar1;
  QWidget *pQVar2;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  QWidget *editor;
  QAbstractItemViewPrivate *d;
  QAbstractItemViewPrivate *in_stack_fffffffffffffff8;
  
  d_func((QAbstractItemView *)0x80880c);
  bVar1 = QAbstractItemViewPrivate::isIndexValid(in_RDI,in_RSI);
  if (bVar1) {
    QAbstractItemViewPrivate::editorForIndex(in_stack_fffffffffffffff8,(QModelIndex *)in_RDI);
    pQVar2 = QPointer<QWidget>::data((QPointer<QWidget> *)0x80883d);
    if (pQVar2 != (QWidget *)0x0) {
      return pQVar2;
    }
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget* QAbstractItemView::indexWidget(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    if (d->isIndexValid(index))
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            return editor;

    return nullptr;
}